

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_monster_msg_vis(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  undefined8 in_RAX;
  monster_race *r;
  char *what;
  char *msg;
  parser_error pVar3;
  wchar_t s_idx;
  
  s_idx = (wchar_t)((ulong)in_RAX >> 0x20);
  r = (monster_race *)parser_priv(p);
  what = parser_getsym(p,"spell");
  _Var1 = parser_hasval(p,"message");
  if (_Var1) {
    msg = parser_getstr(p,"message");
  }
  else {
    msg = (char *)0x0;
  }
  if (r == (monster_race *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    eVar2 = grab_name("monster spell",what,r_info_spell_flags,0x5d,&s_idx);
    if (eVar2 == 0) {
      pVar3 = PARSE_ERROR_NONE;
      add_alternate_spell_message(r,s_idx,MON_ALTMSG_SEEN,msg);
    }
    else {
      pVar3 = PARSE_ERROR_INVALID_SPELL_NAME;
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_monster_msg_vis(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	const char *spell = parser_getsym(p, "spell");
	const char *msg = (parser_hasval(p, "message")) ?
		parser_getstr(p, "message") : NULL;
	int s_idx;

	if (!r) return PARSE_ERROR_MISSING_RECORD_HEADER;
	if (grab_name("monster spell", spell, r_info_spell_flags,
			N_ELEMENTS(r_info_spell_flags) - 1, &s_idx))
			return PARSE_ERROR_INVALID_SPELL_NAME;
	add_alternate_spell_message(r, s_idx, MON_ALTMSG_SEEN, msg);

	return PARSE_ERROR_NONE;
}